

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::java::(anonymous_namespace)::FieldName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  ulong uVar1;
  Type TVar2;
  string *psVar3;
  ulong uVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  TVar2 = FieldDescriptor::type((FieldDescriptor *)this);
  if (TVar2 == TYPE_GROUP) {
    FieldDescriptor::message_type((FieldDescriptor *)this);
  }
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  psVar3 = (string *)std::__cxx11::string::compare((char *)__return_storage_ptr__);
  if ((int)psVar3 != 0) {
    uVar1 = 0;
    do {
      uVar4 = uVar1;
      if (uVar4 == 2) {
        return psVar3;
      }
      psVar3 = (string *)std::__cxx11::string::compare((char *)__return_storage_ptr__);
      uVar1 = uVar4 + 1;
    } while ((int)psVar3 != 0);
    if (1 < uVar4) {
      return psVar3;
    }
  }
  psVar3 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  return psVar3;
}

Assistant:

string FieldName(const FieldDescriptor* field) {
  string field_name;
  // Groups are hacky:  The name of the field is just the lower-cased name
  // of the group type.  In Java, though, we would like to retain the original
  // capitalization of the type name.
  if (GetType(field) == FieldDescriptor::TYPE_GROUP) {
    field_name = field->message_type()->name();
  } else {
    field_name = field->name();
  }
  if (IsForbidden(field_name)) {
    // Append a trailing "#" to indicate that the name should be decorated to
    // avoid collision with other names.
    field_name += "#";
  }
  return field_name;
}